

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<int,duckdb::uhugeint_t,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastFromDecimal>>
               (int *ldata,uhugeint_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  idx_t iVar1;
  uint64_t *puVar2;
  idx_t iVar3;
  uhugeint_t uVar4;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    puVar2 = &result_data->upper;
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      iVar1 = iVar3;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar1 = (idx_t)sel_vector->sel_vector[iVar3];
      }
      uVar4 = VectorDecimalCastOperator<duckdb::TryCastFromDecimal>::
              Operation<int,duckdb::uhugeint_t>(ldata[iVar1],result_mask,iVar3,dataptr);
      ((uhugeint_t *)(puVar2 + -1))->lower = uVar4.lower;
      *puVar2 = uVar4.upper;
      puVar2 = puVar2 + 2;
    }
  }
  else {
    puVar2 = &result_data->upper;
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      iVar1 = iVar3;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar1 = (idx_t)sel_vector->sel_vector[iVar3];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[iVar1 >> 6] >>
           (iVar1 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,iVar3);
      }
      else {
        uVar4 = VectorDecimalCastOperator<duckdb::TryCastFromDecimal>::
                Operation<int,duckdb::uhugeint_t>(ldata[iVar1],result_mask,iVar3,dataptr);
        ((uhugeint_t *)(puVar2 + -1))->lower = uVar4.lower;
        *puVar2 = uVar4.upper;
      }
      puVar2 = puVar2 + 2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}